

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O2

void alSourcePausev(ALsizei n,ALuint *names)

{
  ulong uVar1;
  ulong uVar2;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alSourcePausev);
  IO_ALSIZEI(n);
  IO_UINT64((uint64)names);
  uVar2 = 0;
  uVar1 = 0;
  if (0 < n) {
    uVar1 = (ulong)(uint)n;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    writele32(names[uVar2]);
  }
  (*REAL_alSourcePausev)(n,names);
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    check_source_state_from_name(names[uVar2]);
  }
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alSourcePausev(ALsizei n, const ALuint *names)
{
    ALsizei i;

    IO_START(alSourcePausev);
    IO_ALSIZEI(n);
    IO_PTR(names);
    for (i = 0; i < n; i++) {
        IO_UINT32(names[i]);
    }

    REAL_alSourcePausev(n, names);

    for (i = 0; i < n; i++) {
        check_source_state_from_name(names[i]);
    }

    IO_END();
}